

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetLinkLibsCMP0065
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *linkLanguage,
          cmGeneratorTarget *tgt)

{
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  cmState *this_01;
  ostream *poVar5;
  char *pcVar6;
  PolicyID id;
  PolicyID id_00;
  bool local_332;
  bool local_2f9;
  allocator local_2d9;
  undefined1 local_2d8 [8];
  string linkFlagsVar;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  ostringstream w;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  byte local_64;
  byte local_63;
  byte local_62;
  allocator local_61;
  undefined1 local_60 [4];
  bool add_shlib_flags;
  undefined1 local_29;
  cmGeneratorTarget *local_28;
  cmGeneratorTarget *tgt_local;
  string *linkLanguage_local;
  cmLocalGenerator *this_local;
  string *linkFlags;
  
  local_29 = 0;
  local_28 = tgt;
  tgt_local = (cmGeneratorTarget *)linkLanguage;
  linkLanguage_local = (string *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_62 = 0;
  local_63 = 0;
  TVar3 = cmGeneratorTarget::GetType(local_28);
  local_2f9 = false;
  if (TVar3 == EXECUTABLE) {
    this_01 = cmStateSnapshot::GetState(&this->StateSnapshot);
    std::allocator<char>::allocator();
    local_62 = 1;
    std::__cxx11::string::string((string *)local_60,"TARGET_SUPPORTS_SHARED_LIBS",&local_61);
    local_63 = 1;
    local_2f9 = cmState::GetGlobalPropertyAsBool(this_01,(string *)local_60);
  }
  if ((local_63 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_60);
  }
  if ((local_62 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  if (local_2f9 != false) {
    local_64 = 0;
    PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0065(local_28);
    pcVar1 = local_28;
    switch(PVar4) {
    case WARN:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_88,"ENABLE_EXPORTS",&local_89);
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_88);
      local_332 = false;
      if (!bVar2) {
        this_00 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b0,"CMAKE_POLICY_WARNING_CMP0065",&local_b1);
        local_332 = cmMakefile::PolicyOptionalWarningEnabled(this_00,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      }
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      if (local_332 != false) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_250,(cmPolicies *)0x41,id_00);
        poVar5 = std::operator<<((ostream *)local_230,(string *)&local_250);
        std::operator<<(poVar5,
                        "\nFor compatibility with older versions of CMake, additional flags may be added to export symbols on all executables regardless of their ENABLE_EXPORTS property."
                       );
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::ostringstream::str();
        IssueMessage(this,AUTHOR_WARNING,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
      }
    case OLD:
      local_64 = 1;
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_290,(cmPolicies *)0x41,id);
      IssueMessage(this,FATAL_ERROR,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
    case NEW:
      pcVar1 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2b0,"ENABLE_EXPORTS",
                 (allocator *)(linkFlagsVar.field_2._M_local_buf + 0xf));
      local_64 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)(linkFlagsVar.field_2._M_local_buf + 0xf))
      ;
    }
    if ((local_64 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_2d8,"CMAKE_SHARED_LIBRARY_LINK_",&local_2d9);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      std::__cxx11::string::operator+=((string *)local_2d8,(string *)tgt_local);
      std::__cxx11::string::operator+=((string *)local_2d8,"_FLAGS");
      pcVar6 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_2d8);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar6);
      std::__cxx11::string::~string((string *)local_2d8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetLinkLibsCMP0065(
  std::string const& linkLanguage, cmGeneratorTarget& tgt) const
{
  std::string linkFlags;

  // Flags to link an executable to shared libraries.
  if (tgt.GetType() == cmStateEnums::EXECUTABLE &&
      this->StateSnapshot.GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    bool add_shlib_flags = false;
    switch (tgt.GetPolicyStatusCMP0065()) {
      case cmPolicies::WARN:
        if (!tgt.GetPropertyAsBool("ENABLE_EXPORTS") &&
            this->Makefile->PolicyOptionalWarningEnabled(
              "CMAKE_POLICY_WARNING_CMP0065")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0065) << "\n"
            "For compatibility with older versions of CMake, "
            "additional flags may be added to export symbols on all "
            "executables regardless of their ENABLE_EXPORTS property.";
          /* clang-format on */
          this->IssueMessage(cmake::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to always add the flags
        add_shlib_flags = true;
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0065));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to only add the flags if ENABLE_EXPORTS is on
        add_shlib_flags = tgt.GetPropertyAsBool("ENABLE_EXPORTS");
        break;
    }

    if (add_shlib_flags) {
      std::string linkFlagsVar = "CMAKE_SHARED_LIBRARY_LINK_";
      linkFlagsVar += linkLanguage;
      linkFlagsVar += "_FLAGS";
      linkFlags = this->Makefile->GetSafeDefinition(linkFlagsVar);
    }
  }
  return linkFlags;
}